

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

Slice * __thiscall verilogAST::Slice::clone_impl(Slice *this)

{
  Slice *this_00;
  pointer pEVar1;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_38;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_18;
  Slice *local_10;
  Slice *this_local;
  
  local_10 = this;
  this_00 = (Slice *)operator_new(0x20);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->expr);
  Expression::clone((Expression *)&local_18,(__fn *)pEVar1,__child_stack,in_ECX,in_R8);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->high_index);
  Expression::clone((Expression *)local_30,(__fn *)pEVar1,__child_stack_00,in_ECX,in_R8);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->low_index);
  Expression::clone((Expression *)&local_38,(__fn *)pEVar1,__child_stack_01,in_ECX,in_R8);
  Slice(this_00,&local_18,local_30,&local_38);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_30);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_18);
  return this_00;
}

Assistant:

virtual Slice* clone_impl() const override {
    return new Slice(this->expr->clone(), this->high_index->clone(),
                     this->low_index->clone());
  }